

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

void DoKill(AActor *killtarget,AActor *inflictor,AActor *source,FName *damagetype,int flags,
           PClassActor *filter,FName *species)

{
  PClassActor *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  byte bVar3;
  bool bVar4;
  FName actorSpecies;
  undefined1 local_54 [24];
  FName local_3c;
  DAngle local_38;
  
  local_54._4_8_ = inflictor;
  local_54._12_8_ = source;
  if ((killtarget->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar2 = (**(killtarget->super_DThinker).super_DObject._vptr_DObject)(killtarget);
    (killtarget->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
  }
  pPVar1 = (PClassActor *)(killtarget->super_DThinker).super_DObject.Class;
  iVar2 = species->Index;
  AActor::GetSpecies((AActor *)local_54);
  if (iVar2 == 0) {
    bVar4 = true;
  }
  else if ((flags & 0x20U) == 0) {
    bVar4 = local_54._0_4_ == iVar2;
  }
  else {
    bVar4 = local_54._0_4_ != iVar2;
  }
  bVar3 = filter == (PClassActor *)0x0 | pPVar1 == filter ^ (byte)((flags & 0x10U) >> 4);
  if ((flags & 0x40U) == 0) {
    if ((bVar3 & bVar4) != 1) {
      return;
    }
  }
  else if (bVar3 == 0 && bVar4 == false) {
    return;
  }
  if (((((flags & 2U) != 0) && (((killtarget->flags).Value & 0x10000) != 0)) &&
      (((flags & 1U) != 0 || (((killtarget->flags2).Value & 0x8000000) == 0)))) &&
     ((((flags & 8U) != 0 || (((killtarget->flags7).Value & 0x40) == 0)) &&
      (((killtarget->flags5).Value & 0x40) == 0)))) {
    P_ExplodeMissile(killtarget,(line_t_conflict *)0x0,(AActor *)0x0);
  }
  if ((flags & 4U) == 0) {
    local_3c = (FName)damagetype->Index;
    local_38.Degrees = 0.0;
    P_DamageMobj(killtarget,(AActor *)local_54._4_8_,(AActor *)local_54._12_8_,killtarget->health,
                 &local_3c,0xd1,&local_38);
  }
  return;
}

Assistant:

static void DoKill(AActor *killtarget, AActor *inflictor, AActor *source, FName damagetype, int flags, PClassActor *filter, FName species)
{
	bool filterpass = DoCheckClass(killtarget, filter, !!(flags & KILS_EXFILTER)),
		speciespass = DoCheckSpecies(killtarget, species, !!(flags & KILS_EXSPECIES));
	if ((flags & KILS_EITHER) ? (filterpass || speciespass) : (filterpass && speciespass)) //Check this first. I think it'll save the engine a lot more time this way.
	{
		int dmgFlags = DMG_NO_ARMOR | DMG_NO_FACTOR;

		if (KILS_FOILINVUL)
			dmgFlags |= DMG_FOILINVUL;
		if (KILS_FOILBUDDHA)
			dmgFlags |= DMG_FOILBUDDHA;
	
		if ((killtarget->flags & MF_MISSILE) && (flags & KILS_KILLMISSILES))
		{
			//[MC] Now that missiles can set masters, lets put in a check to properly destroy projectiles. BUT FIRST! New feature~!
			//Check to see if it's invulnerable. Disregarded if foilinvul is on, but never works on a missile with NODAMAGE
			//since that's the whole point of it.
			if ((!(killtarget->flags2 & MF2_INVULNERABLE) || (flags & KILS_FOILINVUL)) &&
				(!(killtarget->flags7 & MF7_BUDDHA) || (flags & KILS_FOILBUDDHA)) && 
				!(killtarget->flags5 & MF5_NODAMAGE))
			{
				P_ExplodeMissile(killtarget, NULL, NULL);
			}
		}
		if (!(flags & KILS_NOMONSTERS))
		{
			P_DamageMobj(killtarget, inflictor, source, killtarget->health, damagetype, dmgFlags);
		}
	}
}